

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryParser.cpp
# Opt level: O0

QString * queryparse::transform_qstring(node *n)

{
  bool bVar1;
  pointer pnVar2;
  pointer in_RSI;
  _Base_ptr in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> opt_vector;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *child_opts;
  QToken child_token;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  *child;
  iterator __end4;
  iterator __begin4;
  children_t *__range4;
  set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> opts;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_> *atom
  ;
  const_iterator __end1;
  const_iterator __begin1;
  children_t *__range1;
  int wildcard_ticks;
  node *root;
  QString *result;
  undefined7 in_stack_fffffffffffffe58;
  char in_stack_fffffffffffffe5f;
  type in_stack_fffffffffffffe60;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe68;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe70;
  allocator_type *in_stack_fffffffffffffe88;
  _Rb_tree_const_iterator<unsigned_char> __last;
  _Rb_tree_const_iterator<unsigned_char> in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  uint8_t in_stack_fffffffffffffeaf;
  vector<QToken,_std::allocator<QToken>_> local_111;
  uchar *local_e8;
  uchar *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_d8;
  QToken local_d0;
  reference local_b8;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  *local_b0;
  __normal_iterator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
  local_a8;
  pointer local_a0;
  QToken local_98 [3];
  reference local_40;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  *local_38;
  __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
  local_30;
  pointer local_28;
  undefined1 local_1d;
  int local_1c;
  pointer local_18;
  pointer local_10;
  
  __last._M_node = in_RDI;
  local_18 = in_RSI;
  local_10 = in_RSI;
  bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::wide_plaintext>
                    (&(in_RSI->super_basic_node<tao::pegtl::parse_tree::node>).
                      super_default_node_content);
  if (bVar1) {
    std::
    vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
    ::operator[]((vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                  *)local_10,0);
    local_18 = std::
               unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
               ::get((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                      *)in_stack_fffffffffffffe60);
  }
  local_1c = 0;
  local_1d = 0;
  Catch::clara::std::vector<QToken,_std::allocator<QToken>_>::vector
            ((vector<QToken,_std::allocator<QToken>_> *)0x22ebb9);
  local_28 = local_18;
  local_30._M_current =
       (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
        *)std::
          vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
          ::begin((vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  local_38 = (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
              *)std::
                vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                ::end((vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                             *)in_stack_fffffffffffffe60,
                            (__normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)), bVar1
        ) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
               ::operator*(&local_30);
    pnVar2 = std::
             unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
             ::operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                           *)0x22ec33);
    bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::hexbyte>
                      (&(pnVar2->super_basic_node<tao::pegtl::parse_tree::node>).
                        super_default_node_content);
    if (bVar1) {
      in_stack_fffffffffffffe88 =
           (allocator_type *)
           std::
           unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
           ::operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                        *)in_stack_fffffffffffffe60);
      transform_hexbyte((node *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      Catch::clara::std::vector<QToken,_std::allocator<QToken>_>::emplace_back<QToken>
                ((vector<QToken,_std::allocator<QToken>_> *)in_stack_fffffffffffffe70._M_current,
                 (QToken *)in_stack_fffffffffffffe68._M_current);
      QToken::~QToken((QToken *)0x22ec91);
    }
    else {
      pnVar2 = std::
               unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
               ::operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                             *)0x22ece2);
      bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::hexoptions>
                        (&(pnVar2->super_basic_node<tao::pegtl::parse_tree::node>).
                          super_default_node_content);
      if (bVar1) {
        std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::set
                  ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
                   0x22ed04);
        local_a0 = std::
                   unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                   ::operator->((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                                 *)0x22ed11);
        local_a8._M_current =
             (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
              *)std::
                vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                ::begin((vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        local_b0 = (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                    *)std::
                      vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                      ::end((vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                                   *)in_stack_fffffffffffffe60,
                                  (__normal_iterator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)),
              bVar1) {
          local_b8 = __gnu_cxx::
                     __normal_iterator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
                     ::operator*(&local_a8);
          std::
          unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
          ::operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                       *)in_stack_fffffffffffffe60);
          transform_hexbyte((node *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
          local_d8 = QToken::possible_values(&local_d0);
          local_e0 = (uchar *)Catch::clara::std::
                              vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         CONCAT17(in_stack_fffffffffffffe5f,
                                                  in_stack_fffffffffffffe58));
          local_e8 = (uchar *)Catch::clara::std::
                              vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         CONCAT17(in_stack_fffffffffffffe5f,
                                                  in_stack_fffffffffffffe58));
          std::set<unsigned_char,std::less<unsigned_char>,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *
                     )in_stack_fffffffffffffe60,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68)
          ;
          QToken::~QToken((QToken *)0x22ee15);
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
          ::operator++(&local_a8);
        }
        in_stack_fffffffffffffe68._M_current = (uchar *)local_98;
        local_111.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
        super__Vector_impl_data._9_8_ =
             std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::
             begin((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        local_111.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
        super__Vector_impl_data._1_8_ =
             std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::end
                       ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                         *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        in_stack_fffffffffffffe70._M_current = (uchar *)&local_111;
        Catch::clara::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x22eea4)
        ;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<std::_Rb_tree_const_iterator<unsigned_char>,void>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,
                   in_stack_fffffffffffffea0,__last,in_stack_fffffffffffffe88);
        Catch::clara::std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)0x22eed5);
        QToken::with_values((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        Catch::clara::std::vector<QToken,_std::allocator<QToken>_>::emplace_back<QToken>
                  ((vector<QToken,_std::allocator<QToken>_> *)in_stack_fffffffffffffe70._M_current,
                   (QToken *)in_stack_fffffffffffffe68._M_current);
        QToken::~QToken((QToken *)0x22ef04);
        Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe70._M_current);
        std::set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>::~set
                  ((set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *)
                   0x22ef1e);
      }
      else {
        in_stack_fffffffffffffe60 =
             std::
             unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
             ::operator*((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                          *)in_stack_fffffffffffffe60);
        in_stack_fffffffffffffe5f =
             transform_char((node *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
        QToken::single(in_stack_fffffffffffffeaf);
        Catch::clara::std::vector<QToken,_std::allocator<QToken>_>::emplace_back<QToken>
                  ((vector<QToken,_std::allocator<QToken>_> *)in_stack_fffffffffffffe70._M_current,
                   (QToken *)in_stack_fffffffffffffe68._M_current);
        QToken::~QToken((QToken *)0x22efeb);
        bVar1 = tao::pegtl::parse_tree::default_node_content::is<queryparse::wide_plaintext>
                          (&(local_10->super_basic_node<tao::pegtl::parse_tree::node>).
                            super_default_node_content);
        if (bVar1) {
          QToken::single(in_stack_fffffffffffffeaf);
          Catch::clara::std::vector<QToken,_std::allocator<QToken>_>::emplace_back<QToken>
                    ((vector<QToken,_std::allocator<QToken>_> *)in_stack_fffffffffffffe70._M_current
                     ,(QToken *)in_stack_fffffffffffffe68._M_current);
          QToken::~QToken((QToken *)0x22f02b);
        }
      }
    }
    local_1c = local_1c + -1;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_*,_std::vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>_>
    ::operator++(&local_30);
  }
  return (QString *)__last._M_node;
}

Assistant:

QString transform_qstring(const parse_tree::node &n) {
    auto *root = &n;

    if (n.is<wide_plaintext>()) {
        // Unpack plaintext from inside wide_plaintext.
        root = n.children[0].get();
    }

    int wildcard_ticks = 0;

    QString result;
    for (auto &atom : root->children) {
        if (atom->is<hexbyte>()) {
            result.emplace_back(transform_hexbyte(*atom));
        } else if (atom->is<hexoptions>()) {
            std::set<uint8_t> opts;
            for (const auto &child : (*&atom)->children) {
                auto child_token{transform_hexbyte(*child)};
                auto &child_opts{child_token.possible_values()};
                opts.insert(child_opts.begin(), child_opts.end());
            }
            std::vector<uint8_t> opt_vector{opts.begin(), opts.end()};
            result.emplace_back(QToken::with_values(std::move(opt_vector)));
        } else {
            result.emplace_back(
                std::move(QToken::single(transform_char(*atom))));

            if (n.is<wide_plaintext>()) {
                result.emplace_back(std::move(QToken::single('\0')));
            }
        }

        wildcard_ticks--;
    }

    return result;
}